

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void __thiscall AnonADIOSFile::~AnonADIOSFile(AnonADIOSFile *this)

{
  string local_30 [32];
  
  adios2::core::Engine::Close((int)this->m_engine);
  std::__cxx11::string::string(local_30,(string *)&this->m_IOname);
  adios2::core::ADIOS::RemoveIO(adios,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&this->m_FileName);
  std::__cxx11::string::~string((string *)&this->m_IOname);
  return;
}

Assistant:

~AnonADIOSFile()
    {
        m_engine->Close();
        adios.RemoveIO(m_IOname);
    }